

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O2

String * __thiscall
capnp::anon_unknown_79::Parser::consumeQuotedString(String *__return_storage_ptr__,Parser *this)

{
  Input *this_00;
  char *pcVar1;
  char cVar2;
  byte bVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  ArrayPtr<const_char16_t> utf16;
  char c;
  undefined1 uStack_a1;
  Fault f;
  ArrayPtr<const_char> stringValue;
  Vector<char> decoded;
  Array<char> local_48;
  
  this_00 = &this->input;
  Input::consume(this_00,'\"');
  decoded.builder.endPtr = (char *)0x0;
  decoded.builder.ptr = (char *)0x0;
  decoded.builder.pos = (RemoveConst<char> *)0x0;
  do {
    pcVar1 = (this_00->wrapped).ptr;
    while (((this->input).wrapped.size_ != 0 && (*(this_00->wrapped).ptr != '\0'))) {
      cVar2 = Input::nextChar(this_00);
      if ((cVar2 == '\"') || (cVar2 == '\\')) break;
      Input::advance(this_00,1);
    }
    stringValue.size_ = (long)(this_00->wrapped).ptr - (long)pcVar1;
    stringValue.ptr = pcVar1;
    kj::Vector<char>::addAll<kj::ArrayPtr<char_const>&>(&decoded,&stringValue);
    cVar2 = Input::nextChar(this_00);
    if (cVar2 == '\\') {
      Input::advance(this_00,1);
      bVar3 = Input::nextChar(this_00);
      if (bVar3 - 0x6e < 8) {
        switch((uint)bVar3) {
        case 0x6e:
          f.exception._0_1_ = 10;
          kj::Vector<char>::add<char>(&decoded,(char *)&f);
          break;
        default:
switchD_0022a225_caseD_6f:
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
                    (&f,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
                     ,0x302,FAILED,(char *)0x0,"\"Invalid escape in JSON string.\"",
                     (char (*) [31])"Invalid escape in JSON string.");
          kj::_::Debug::Fault::fatal(&f);
        case 0x72:
          f.exception._0_1_ = 0xd;
          kj::Vector<char>::add<char>(&decoded,(char *)&f);
          break;
        case 0x74:
          f.exception._0_1_ = 9;
          kj::Vector<char>::add<char>(&decoded,(char *)&f);
          break;
        case 0x75:
          Input::consume(this_00,'u');
          pcVar1 = (this_00->wrapped).ptr;
          Input::advance(this_00,4);
          if ((long)(this_00->wrapped).ptr - (long)pcVar1 != 4) {
            kj::_::Debug::Fault::Fault
                      (&f,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
                       ,0x32c,FAILED,"hex.size() == 4","");
            kj::_::Debug::Fault::fatal(&f);
          }
          uVar4 = 0;
          for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
            cVar2 = pcVar1[lVar5];
            _c = CONCAT11(uStack_a1,cVar2);
            iVar6 = -0x30;
            if (9 < (byte)(cVar2 - 0x30U)) {
              iVar6 = -0x61;
              if (5 < (byte)(cVar2 + 0x9fU)) {
                iVar6 = -0x41;
                if (5 < (byte)(cVar2 + 0xbfU)) {
                  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[37],char&>
                            (&f,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
                             ,0x33a,FAILED,(char *)0x0,"\"Invalid hex digit in unicode escape.\", c"
                             ,(char (*) [37])"Invalid hex digit in unicode escape.",&c);
                  kj::_::Debug::Fault::fatal(&f);
                }
              }
            }
            uVar4 = uVar4 << 4 | iVar6 + cVar2;
          }
          if ((int)uVar4 < 0x80) {
            f.exception._0_4_ = uVar4 & 0x7f;
            kj::Vector<char>::add<int>(&decoded,(int *)&f);
          }
          else {
            _c = (undefined2)uVar4;
            utf16.size_ = 4;
            utf16.ptr = (char16_t *)0x1;
            kj::decodeUtf16((EncodingResult<kj::String> *)&f,(kj *)&c,utf16);
            kj::Vector<char>::addAll<kj::EncodingResult<kj::String>>
                      (&decoded,(EncodingResult<kj::String> *)&f);
            kj::Array<char>::~Array((Array<char> *)&f);
          }
          goto LAB_0022a315;
        }
      }
      else if (bVar3 == 0x22) {
        f.exception._0_1_ = 0x22;
        kj::Vector<char>::add<char>(&decoded,(char *)&f);
      }
      else if (bVar3 == 0x2f) {
        f.exception._0_1_ = 0x2f;
        kj::Vector<char>::add<char>(&decoded,(char *)&f);
      }
      else if (bVar3 == 0x5c) {
        f.exception._0_1_ = 0x5c;
        kj::Vector<char>::add<char>(&decoded,(char *)&f);
      }
      else if (bVar3 == 0x62) {
        f.exception._0_1_ = 8;
        kj::Vector<char>::add<char>(&decoded,(char *)&f);
      }
      else {
        if (bVar3 != 0x66) goto switchD_0022a225_caseD_6f;
        f.exception._0_1_ = 0xc;
        kj::Vector<char>::add<char>(&decoded,(char *)&f);
      }
      Input::advance(this_00,1);
    }
LAB_0022a315:
    cVar2 = Input::nextChar(this_00);
    if (cVar2 == '\"') {
      Input::consume(this_00,'\"');
      f.exception._0_4_ = (uint)f.exception & 0xffffff00;
      kj::Vector<char>::add<char>(&decoded,(char *)&f);
      kj::Vector<char>::releaseAsArray(&local_48,&decoded);
      (__return_storage_ptr__->content).ptr = local_48.ptr;
      (__return_storage_ptr__->content).size_ = local_48.size_;
      (__return_storage_ptr__->content).disposer = local_48.disposer;
      local_48.ptr = (char *)0x0;
      local_48.size_ = 0;
      kj::Array<char>::~Array(&local_48);
      kj::ArrayBuilder<char>::dispose(&decoded.builder);
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

kj::String consumeQuotedString() {
    input.consume('"');
    // TODO(perf): Avoid copy / alloc if no escapes encoutered.
    // TODO(perf): Get statistics on string size and preallocate?
    kj::Vector<char> decoded;

    do {
      auto stringValue = input.consumeWhile([](const char chr) {
          return chr != '"' && chr != '\\';
      });

      decoded.addAll(stringValue);

      if (input.nextChar() == '\\') {  // handle escapes.
        input.advance();
        switch(input.nextChar()) {
          case '"' : decoded.add('"' ); input.advance(); break;
          case '\\': decoded.add('\\'); input.advance(); break;
          case '/' : decoded.add('/' ); input.advance(); break;
          case 'b' : decoded.add('\b'); input.advance(); break;
          case 'f' : decoded.add('\f'); input.advance(); break;
          case 'n' : decoded.add('\n'); input.advance(); break;
          case 'r' : decoded.add('\r'); input.advance(); break;
          case 't' : decoded.add('\t'); input.advance(); break;
          case 'u' :
            input.consume('u');
            unescapeAndAppend(input.consume(size_t(4)), decoded);
            break;
          default: KJ_FAIL_REQUIRE("Invalid escape in JSON string."); break;
        }
      }

    } while(input.nextChar() != '"');

    input.consume('"');
    decoded.add('\0');

    // TODO(perf): This copy can be eliminated, but I can't find the kj::wayToDoIt();
    return kj::String(decoded.releaseAsArray());
  }